

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Array<unsigned_char> * __thiscall
kj::anon_unknown_35::InMemoryFile::mmapPrivate
          (Array<unsigned_char> *__return_storage_ptr__,InMemoryFile *this,uint64_t offset,
          uint64_t size)

{
  ulong uVar1;
  
  heapArray<unsigned_char>(__return_storage_ptr__,size);
  uVar1 = read(this,(int)offset,__return_storage_ptr__->ptr,__return_storage_ptr__->size_);
  if (uVar1 <= size && size - uVar1 != 0) {
    memset(__return_storage_ptr__->ptr + uVar1,0,size - uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> mmapPrivate(uint64_t offset, uint64_t size) const override {
    // Return a copy.

    // Allocate exactly the size requested.
    auto result = heapArray<byte>(size);

    // Use read() to fill it.
    size_t actual = read(offset, result);

    // Ignore the rest.
    if (actual < size) {
      memset(result.begin() + actual, 0, size - actual);
    }

    return result;
  }